

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

void Curl_req_hard_reset(SingleRequest *req,Curl_easy *data)

{
  time_t local_28;
  curltime t0;
  Curl_easy *data_local;
  SingleRequest *req_local;
  
  t0._8_8_ = data;
  memset(&local_28,0,0x10);
  (*Curl_cfree)((req->p).file);
  (req->p).file = (FILEPROTO *)0x0;
  (*Curl_cfree)(req->newurl);
  req->newurl = (char *)0x0;
  Curl_client_reset((Curl_easy *)t0._8_8_);
  if ((*(uint *)&req->field_0xd1 >> 0x13 & 1) != 0) {
    Curl_bufq_reset(&req->sendbuf);
  }
  Curl_doh_close((Curl_easy *)t0._8_8_);
  req->size = -1;
  req->maxdownload = -1;
  req->bytecount = 0;
  req->writebytecount = 0;
  (req->start).tv_sec = local_28;
  *(time_t *)&(req->start).tv_usec = t0.tv_sec;
  req->headerbytecount = 0;
  req->allheadercount = 0;
  req->deductheadercount = 0;
  req->headerline = 0;
  req->offset = 0;
  req->httpcode = 0;
  req->keepon = 0;
  req->upgr101 = UPGR101_INIT;
  req->sendbuf_hds_len = 0;
  req->timeofdoc = 0;
  req->location = (char *)0x0;
  req->newurl = (char *)0x0;
  req->setcookies = '\0';
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffffe;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffffb;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffff7;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffffffef;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffffffdf;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffffffbf;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffeff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffdff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffffbff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffff7ff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffffefff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffffbfff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffff7fff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffeffff;
  *(uint *)&req->field_0xd1 =
       *(uint *)&req->field_0xd1 & 0xfffdffff |
       ((uint)(*(ulong *)(t0._8_8_ + 0xa2c) >> 0x1d) & 1) << 0x11;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xfffbffff;
  *(uint *)&req->field_0xd1 = *(uint *)&req->field_0xd1 & 0xffefffff;
  return;
}

Assistant:

void Curl_req_hard_reset(struct SingleRequest *req, struct Curl_easy *data)
{
  struct curltime t0 = {0, 0};

  /* This is a bit ugly. `req->p` is a union and we assume we can
   * free this safely without leaks. */
  Curl_safefree(req->p.ftp);
  Curl_safefree(req->newurl);
  Curl_client_reset(data);
  if(req->sendbuf_init)
    Curl_bufq_reset(&req->sendbuf);

#ifndef CURL_DISABLE_DOH
  Curl_doh_close(data);
#endif
  /* Can no longer memset() this struct as we need to keep some state */
  req->size = -1;
  req->maxdownload = -1;
  req->bytecount = 0;
  req->writebytecount = 0;
  req->start = t0;
  req->headerbytecount = 0;
  req->allheadercount =  0;
  req->deductheadercount = 0;
  req->headerline = 0;
  req->offset = 0;
  req->httpcode = 0;
  req->keepon = 0;
  req->upgr101 = UPGR101_INIT;
  req->sendbuf_hds_len = 0;
  req->timeofdoc = 0;
  req->location = NULL;
  req->newurl = NULL;
#ifndef CURL_DISABLE_COOKIES
  req->setcookies = 0;
#endif
  req->header = FALSE;
  req->content_range = FALSE;
  req->download_done = FALSE;
  req->eos_written = FALSE;
  req->eos_read = FALSE;
  req->eos_sent = FALSE;
  req->upload_done = FALSE;
  req->upload_aborted = FALSE;
  req->ignorebody = FALSE;
  req->http_bodyless = FALSE;
  req->chunk = FALSE;
  req->ignore_cl = FALSE;
  req->upload_chunky = FALSE;
  req->getheader = FALSE;
  req->no_body = data->set.opt_no_body;
  req->authneg = FALSE;
  req->shutdown = FALSE;
}